

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

FullType flatbuffers::anon_unknown_26::GetFullType(Type *type)

{
  bool bVar1;
  FullType FVar2;
  Type local_58;
  Type local_38;
  Type *local_18;
  Type *type_local;
  
  local_18 = type;
  bVar1 = IsString(type);
  if (bVar1) {
    type_local._4_4_ = ftString;
  }
  else if (local_18->base_type == BASE_TYPE_STRUCT) {
    if ((local_18->struct_def->fixed & 1U) == 0) {
      type_local._4_4_ = ftTable;
    }
    else {
      type_local._4_4_ = ftStruct;
    }
  }
  else {
    bVar1 = IsVector(local_18);
    if (bVar1) {
      Type::VectorType(&local_38,local_18);
      FVar2 = GetFullType(&local_38);
      switch(FVar2) {
      case ftInteger:
        type_local._4_4_ = ftVectorOfInteger;
        break;
      case ftFloat:
        type_local._4_4_ = ftVectorOfFloat;
        break;
      case ftBool:
        type_local._4_4_ = ftVectorOfBool;
        break;
      case ftStruct:
        type_local._4_4_ = ftVectorOfStruct;
        break;
      case ftTable:
        type_local._4_4_ = ftVectorOfTable;
        break;
      case ftEnumKey:
        type_local._4_4_ = ftVectorOfEnumKey;
        break;
      case ftUnionKey:
      case ftUnionValue:
        __assert_fail("false && \"vectors of unions are unsupported\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                      ,0xd7,"FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)"
                     );
      case ftString:
        type_local._4_4_ = ftVectorOfString;
        break;
      default:
        __assert_fail("false && \"vector of vectors are unsupported\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                      ,0xdb,"FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)"
                     );
      }
    }
    else {
      bVar1 = IsArray(local_18);
      if (bVar1) {
        Type::VectorType(&local_58,local_18);
        FVar2 = GetFullType(&local_58);
        if (FVar2 < ftStruct) {
          type_local._4_4_ = ftArrayOfBuiltin;
        }
        else if (FVar2 == ftStruct) {
          type_local._4_4_ = ftArrayOfStruct;
        }
        else {
          if (FVar2 != ftEnumKey) {
            __assert_fail("false && \"Unsupported type for fixed array\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                          ,0xec,
                          "FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
          }
          type_local._4_4_ = ftArrayOfEnum;
        }
      }
      else if (local_18->enum_def == (EnumDef *)0x0) {
        bVar1 = IsScalar(local_18->base_type);
        if (!bVar1) {
          __assert_fail("false && \"completely unknown type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                        ,0x107,
                        "FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
        }
        bVar1 = IsBool(local_18->base_type);
        if (bVar1) {
          type_local._4_4_ = ftBool;
        }
        else {
          bVar1 = IsInteger(local_18->base_type);
          if (bVar1) {
            type_local._4_4_ = ftInteger;
          }
          else {
            bVar1 = IsFloat(local_18->base_type);
            if (!bVar1) {
              __assert_fail("false && \"unknown number type\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                            ,0x103,
                            "FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)"
                           );
            }
            type_local._4_4_ = ftFloat;
          }
        }
      }
      else if ((local_18->enum_def->is_union & 1U) == 0) {
        type_local._4_4_ = ftEnumKey;
      }
      else if (local_18->base_type == BASE_TYPE_UNION) {
        type_local._4_4_ = ftUnionValue;
      }
      else {
        bVar1 = IsInteger(local_18->base_type);
        if (!bVar1) {
          __assert_fail("false && \"unknown union field type\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp"
                        ,0xf6,
                        "FullType flatbuffers::(anonymous namespace)::GetFullType(const Type &)");
        }
        type_local._4_4_ = ftUnionKey;
      }
    }
  }
  return type_local._4_4_;
}

Assistant:

static FullType GetFullType(const Type &type) {
  // N.B. The order of these conditionals matters for some types.

  if (IsString(type)) {
    return ftString;
  } else if (type.base_type == BASE_TYPE_STRUCT) {
    if (type.struct_def->fixed) {
      return ftStruct;
    } else {
      return ftTable;
    }
  } else if (IsVector(type)) {
    switch (GetFullType(type.VectorType())) {
      case ftInteger: {
        return ftVectorOfInteger;
      }
      case ftFloat: {
        return ftVectorOfFloat;
      }
      case ftBool: {
        return ftVectorOfBool;
      }
      case ftStruct: {
        return ftVectorOfStruct;
      }
      case ftTable: {
        return ftVectorOfTable;
      }
      case ftString: {
        return ftVectorOfString;
      }
      case ftEnumKey: {
        return ftVectorOfEnumKey;
      }
      case ftUnionKey:
      case ftUnionValue: {
        FLATBUFFERS_ASSERT(false && "vectors of unions are unsupported");
        break;
      }
      default: {
        FLATBUFFERS_ASSERT(false && "vector of vectors are unsupported");
      }
    }
  } else if (IsArray(type)) {
    switch (GetFullType(type.VectorType())) {
      case ftInteger:
      case ftFloat:
      case ftBool: {
        return ftArrayOfBuiltin;
      }
      case ftStruct: {
        return ftArrayOfStruct;
      }
      case ftEnumKey: {
        return ftArrayOfEnum;
      }
      default: {
        FLATBUFFERS_ASSERT(false && "Unsupported type for fixed array");
      }
    }
  } else if (type.enum_def != nullptr) {
    if (type.enum_def->is_union) {
      if (type.base_type == BASE_TYPE_UNION) {
        return ftUnionValue;
      } else if (IsInteger(type.base_type)) {
        return ftUnionKey;
      } else {
        FLATBUFFERS_ASSERT(false && "unknown union field type");
      }
    } else {
      return ftEnumKey;
    }
  } else if (IsScalar(type.base_type)) {
    if (IsBool(type.base_type)) {
      return ftBool;
    } else if (IsInteger(type.base_type)) {
      return ftInteger;
    } else if (IsFloat(type.base_type)) {
      return ftFloat;
    } else {
      FLATBUFFERS_ASSERT(false && "unknown number type");
    }
  }

  FLATBUFFERS_ASSERT(false && "completely unknown type");

  // this is only to satisfy the compiler's return analysis.
  return ftBool;
}